

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

bool flatbuffers::StringToIntegerImpl<long>(long *val,char *str,int base,bool check_errno)

{
  int *piVar1;
  byte *pbVar2;
  longlong lVar3;
  byte bVar4;
  char *endptr;
  char *local_30;
  
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x11f,
                  "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                 );
  }
  if (base < 1) {
    bVar4 = *str;
    if (bVar4 != 0) {
      pbVar2 = (byte *)(str + 1);
      do {
        if ((int)(char)bVar4 - 0x30U < 10) {
          if ((bVar4 == 0x30) && ((*pbVar2 & 0xdf) == 0x58)) {
            if (check_errno) {
              piVar1 = __errno_location();
              *piVar1 = 0;
            }
            base = 0x10;
            goto LAB_0013cb1f;
          }
          break;
        }
        bVar4 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      } while (bVar4 != 0);
    }
    if (check_errno) {
      piVar1 = __errno_location();
      *piVar1 = 0;
    }
    base = 10;
  }
  else if (check_errno) {
    piVar1 = __errno_location();
    *piVar1 = 0;
  }
LAB_0013cb1f:
  local_30 = str;
  lVar3 = strtoll_l(str,&local_30,base,ClassicLocale::instance_);
  *val = lVar3;
  if ((local_30 == str) || (*local_30 != '\0')) {
    *val = 0;
  }
  else if ((!check_errno) || (piVar1 = __errno_location(), *piVar1 == 0)) {
    return true;
  }
  return false;
}

Assistant:

inline bool StringToIntegerImpl(T *val, const char *const str,
                                const int base = 0,
                                const bool check_errno = true) {
  // T is int64_t or uint64_T
  FLATBUFFERS_ASSERT(str);
  if (base <= 0) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    if (s[0] == '0' && is_alpha_char(s[1], 'X'))
      return StringToIntegerImpl(val, str, 16, check_errno);
    // if a prefix not match, try base=10
    return StringToIntegerImpl(val, str, 10, check_errno);
  } else {
    if (check_errno) errno = 0;  // clear thread-local errno
    auto endptr = str;
    strtoval_impl(val, str, const_cast<char **>(&endptr), base);
    if ((*endptr != '\0') || (endptr == str)) {
      *val = 0;      // erase partial result
      return false;  // invalid string
    }
    // errno is out-of-range, return MAX/MIN
    if (check_errno && errno) return false;
    return true;
  }
}